

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

string * __thiscall
Assimp::Ogre::VertexElement::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,VertexElement *this,Type type)

{
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  Type type_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FLOAT1",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FLOAT2",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FLOAT3",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FLOAT4",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"COLOUR",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SHORT1",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SHORT2",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SHORT3",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SHORT4",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UBYTE4",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"COLOUR_ARGB",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"COLOUR_ABGR",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOUBLE1",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOUBLE2",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOUBLE3",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOUBLE4",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"USHORT1",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"USHORT2",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"USHORT3",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"USHORT4",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INT1",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case 0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INT2",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case 0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INT3",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case 0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INT4",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case 0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UINT1",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UINT2",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UINT3",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UINT4",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uknown_VertexElement::Type",&local_40);
    std::allocator<char>::~allocator(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VertexElement::TypeToString(Type type)
{
    switch(type)
    {
        case VET_COLOUR:        return "COLOUR";
        case VET_COLOUR_ABGR:   return "COLOUR_ABGR";
        case VET_COLOUR_ARGB:   return "COLOUR_ARGB";
        case VET_FLOAT1:        return "FLOAT1";
        case VET_FLOAT2:        return "FLOAT2";
        case VET_FLOAT3:        return "FLOAT3";
        case VET_FLOAT4:        return "FLOAT4";
        case VET_DOUBLE1:       return "DOUBLE1";
        case VET_DOUBLE2:       return "DOUBLE2";
        case VET_DOUBLE3:       return "DOUBLE3";
        case VET_DOUBLE4:       return "DOUBLE4";
        case VET_SHORT1:        return "SHORT1";
        case VET_SHORT2:        return "SHORT2";
        case VET_SHORT3:        return "SHORT3";
        case VET_SHORT4:        return "SHORT4";
        case VET_USHORT1:       return "USHORT1";
        case VET_USHORT2:       return "USHORT2";
        case VET_USHORT3:       return "USHORT3";
        case VET_USHORT4:       return "USHORT4";
        case VET_INT1:          return "INT1";
        case VET_INT2:          return "INT2";
        case VET_INT3:          return "INT3";
        case VET_INT4:          return "INT4";
        case VET_UINT1:         return "UINT1";
        case VET_UINT2:         return "UINT2";
        case VET_UINT3:         return "UINT3";
        case VET_UINT4:         return "UINT4";
        case VET_UBYTE4:        return "UBYTE4";
    }
    return "Uknown_VertexElement::Type";
}